

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

ON_MeshNgon * __thiscall
ON_MeshNgonBuffer::CreateFromTriangle
          (ON_MeshNgonBuffer *this,uint *triangle_vertex_indices,uint face_index)

{
  ON_MeshNgon *pOVar1;
  uint quad_vertex_indices [4];
  uint local_18;
  uint local_14;
  uint local_10;
  undefined4 local_c;
  
  if (triangle_vertex_indices == (uint *)0x0) {
    ON_IsNullPtr(this);
    pOVar1 = (ON_MeshNgon *)0x0;
  }
  else {
    local_18 = *triangle_vertex_indices;
    local_14 = triangle_vertex_indices[1];
    local_10 = triangle_vertex_indices[2];
    local_c = 0;
    pOVar1 = ON_MeshNgon::NgonFromMeshFace(this,face_index,&local_18);
  }
  return pOVar1;
}

Assistant:

const class ON_MeshNgon* ON_MeshNgonBuffer::CreateFromTriangle(
  const unsigned int triangle_vertex_indices[3],
  unsigned int face_index
  )
{
  if ( 0 != triangle_vertex_indices )
  {
    const unsigned int quad_vertex_indices[4] = {
      triangle_vertex_indices[0],
      triangle_vertex_indices[1],
      triangle_vertex_indices[2],
      0
    };
    return ON_MeshNgon::NgonFromMeshFace(*this,face_index,quad_vertex_indices);
  }
  return ON_MeshNgon::NgonFromMeshFace(*this,face_index,0);
}